

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# size.cpp
# Opt level: O2

void __thiscall ftxui::anon_unknown_4::Size::SetBox(Size *this,Box box)

{
  element_type *peVar1;
  uint uVar2;
  ulong uVar3;
  ulong uVar4;
  
  uVar4 = box._0_8_ >> 0x20;
  uVar3 = box._8_8_ >> 0x20;
  Node::SetBox(&this->super_Node,box);
  if (*(int *)&(this->super_Node).field_0x5c == 0) {
    if ((this->constraint_ < GREATER_THAN) &&
       (uVar2 = this->value_ + box.x_min + 1, (int)uVar2 < box.x_max)) {
      uVar4 = (ulong)uVar2;
    }
  }
  else if ((this->constraint_ < GREATER_THAN) &&
          (uVar2 = this->value_ + box.y_min + 1, (int)uVar2 < box.y_max)) {
    uVar3 = (ulong)uVar2;
  }
  peVar1 = (((this->super_Node).children_.
             super__Vector_base<std::shared_ptr<ftxui::Node>,_std::allocator<std::shared_ptr<ftxui::Node>_>_>
             ._M_impl.super__Vector_impl_data._M_start)->
           super___shared_ptr<ftxui::Node,_(__gnu_cxx::_Lock_policy)2>)._M_ptr;
  (**(code **)((long)peVar1->_vptr_Node + 0x18))
            (peVar1,box._0_8_ & 0xffffffff | uVar4 << 0x20,box._8_8_ & 0xffffffff | uVar3 << 0x20);
  return;
}

Assistant:

void SetBox(Box box) override {
    Node::SetBox(box);

    if (direction_ == WIDTH) {
      switch (constraint_) {
        case LESS_THAN:
        case EQUAL:
          box.x_max = std::min(box.x_min + value_ + 1, box.x_max);
          break;
        case GREATER_THAN:
          break;
      }
    } else {
      switch (constraint_) {
        case LESS_THAN:
        case EQUAL:
          box.y_max = std::min(box.y_min + value_ + 1, box.y_max);
          break;
        case GREATER_THAN:
          break;
      }
    }
    children_[0]->SetBox(box);
  }